

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateSwitchStringLookup(Lowerer *this,Instr *instr)

{
  uint index;
  long *plVar1;
  Func *func;
  LabelInstr *targetLabel;
  BranchInstr *pBVar2;
  MultiBranchInstr *pMVar3;
  RegOpnd *dst;
  RegOpnd *baseOpnd;
  IndirOpnd *src;
  IntConstOpnd *pIVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  Lowerer *this_00;
  int iVar8;
  uint uVar9;
  BVUnitT<unsigned_int> local_34 [2];
  BVUnit32 bvLength;
  
  local_34[0].word = 0;
  pBVar2 = IR::Instr::AsBranchInstr(instr);
  pMVar3 = IR::BranchInstr::AsMultiBrInstr(pBVar2);
  plVar1 = (long *)pMVar3->m_branchTargets;
  uVar9 = 0;
  uVar7 = 0xffffffff;
  for (uVar6 = 0; uVar6 < *(uint *)((long)plVar1 + 0x1c); uVar6 = uVar6 + 1) {
    iVar8 = *(int *)(*plVar1 + uVar6 * 4);
    if (iVar8 != -1) {
      while (iVar8 != -1) {
        lVar5 = (long)iVar8;
        iVar8 = *(int *)(plVar1[1] + 8 + lVar5 * 0x18);
        index = *(uint *)(*(long *)(plVar1[1] + 0x10 + lVar5 * 0x18) + 0x18);
        if (index <= uVar7) {
          uVar7 = index;
        }
        if (uVar9 <= index) {
          uVar9 = index;
        }
        if (index < 0x20) {
          BVUnitT<unsigned_int>::Set(local_34,index);
        }
      }
    }
  }
  func = instr->m_func;
  dst = IR::RegOpnd::New(TyUint32,func);
  baseOpnd = IR::Opnd::AsRegOpnd(instr->m_src1);
  src = IR::IndirOpnd::New(baseOpnd,0x18,TyUint32,func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,true);
  pBVar2 = IR::Instr::AsBranchInstr(instr);
  pMVar3 = IR::BranchInstr::AsMultiBrInstr(pBVar2);
  targetLabel = *(LabelInstr **)((long)pMVar3->m_branchTargets + 0x38);
  if (uVar7 == uVar9) {
    this_00 = (Lowerer *)(ulong)uVar7;
    pIVar4 = IR::IntConstOpnd::New((IntConstType)this_00,TyUint32,func,false);
    InsertCompareBranch(this_00,&dst->super_Opnd,&pIVar4->super_Opnd,BrNeq_A,targetLabel,instr,false
                       );
  }
  else if (uVar9 < 0x20) {
    pIVar4 = IR::IntConstOpnd::New((ulong)local_34[0].word,TyUint32,func,false);
    InsertBitTestBranch(this,&pIVar4->super_Opnd,&dst->super_Opnd,false,targetLabel,instr);
    pIVar4 = IR::IntConstOpnd::New(0xffffffe0,TyUint32,func,false);
    InsertTestBranch(&dst->super_Opnd,&pIVar4->super_Opnd,BrNeq_A,targetLabel,instr);
  }
  LowerMultiBr(this,instr,HelperOp_SwitchStringLookUp);
  return;
}

Assistant:

void Lowerer::GenerateSwitchStringLookup(IR::Instr * instr)
{
    /* Collect information about string length in all the case*/
    charcount_t minLength = UINT_MAX;
    charcount_t maxLength = 0;
    BVUnit32 bvLength;
    instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->dictionary.Map([&](JITJavascriptString * str, void *)
    {
        charcount_t len = str->GetLength();
        minLength = min(minLength, str->GetLength());
        maxLength = max(maxLength, str->GetLength());
        if (len < 32)
        {
            bvLength.Set(len);
        }
    });

    Func * func = instr->m_func;
    IR::RegOpnd * strLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    InsertMove(strLengthOpnd, IR::IndirOpnd::New(instr->GetSrc1()->AsRegOpnd(), Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func), instr);
    IR::LabelInstr * defaultLabelInstr = (IR::LabelInstr *)instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->defaultTarget;
    if (minLength == maxLength)
    {
        // Generate single length filter
        InsertCompareBranch(strLengthOpnd, IR::IntConstOpnd::New(minLength, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else if (maxLength < 32)
    {
        // Generate bit filter

        // Jump to default label if the bit is not on for the length % 32
        IR::IntConstOpnd * lenBitMaskOpnd = IR::IntConstOpnd::New(bvLength.GetWord(), TyUint32, func);
        InsertBitTestBranch(lenBitMaskOpnd, strLengthOpnd, false, defaultLabelInstr, instr);
        // Jump to default label if the bit is > 32
        InsertTestBranch(strLengthOpnd, IR::IntConstOpnd::New(UINT32_MAX ^ 31, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else
    {
        // CONSIDER: Generate range filter
    }
    this->LowerMultiBr(instr, IR::HelperOp_SwitchStringLookUp);
}